

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mylinkedList.h
# Opt level: O2

void __thiscall linkedList<recordsBucket>::clear(linkedList<recordsBucket> *this)

{
  l_node<recordsBucket> *plVar1;
  l_node<recordsBucket> *this_00;
  
  if (this->size != 0) {
    this_00 = this->head;
    while (this_00 != (l_node<recordsBucket> *)0x0) {
      plVar1 = this_00->next;
      recordsBucket::~recordsBucket(&this_00->data);
      operator_delete(this_00,0x20);
      this_00 = plVar1;
    }
    this->head = (l_node<recordsBucket> *)0x0;
    this->tail = (l_node<recordsBucket> *)0x0;
    this->size = 0;
  }
  return;
}

Assistant:

bool linkedList<T>::isEmpty() const
{
//    return head == nullptr && tail == nullptr; //if the start pointer and end pointer are NULL then the list is empty
    return (! this->size);
}